

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_encoder.h
# Opt level: O3

exr_result_t
LossyDctEncoder_base_construct
          (LossyDctEncoder *e,float quantBaseError,uint8_t *packedAc,uint8_t *packedDc,
          uint16_t *toNonlinear,int width,int height)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  e->_quantBaseError = quantBaseError;
  e->_width = width;
  e->_height = height;
  e->_toNonlinear = toNonlinear;
  e->_numAcComp = 0;
  e->_numDcComp = 0;
  e->_packedAc = packedAc;
  e->_packedDc = packedDc;
  if (quantBaseError < 0.0) {
    e->_quantBaseError = 0.0;
    quantBaseError = 0.0;
  }
  auVar2 = _DAT_0016a4c0;
  auVar1 = _DAT_0016a4b0;
  lVar3 = 0;
  do {
    auVar4._0_4_ = (float)*(int *)(&DAT_0030a580 + lVar3) * quantBaseError;
    auVar4._4_4_ = (float)*(int *)(&UNK_0030a584 + lVar3) * quantBaseError;
    auVar4._8_4_ = (float)*(int *)(&UNK_0030a588 + lVar3) * quantBaseError;
    auVar4._12_4_ = (float)*(int *)(&UNK_0030a58c + lVar3) * quantBaseError;
    auVar4 = divps(auVar4,auVar1);
    *(undefined1 (*) [16])((long)e->_quantTableY + lVar3) = auVar4;
    auVar5._0_4_ = (float)*(int *)(&DAT_0030a680 + lVar3) * quantBaseError;
    auVar5._4_4_ = (float)*(int *)(&UNK_0030a684 + lVar3) * quantBaseError;
    auVar5._8_4_ = (float)*(int *)(&UNK_0030a688 + lVar3) * quantBaseError;
    auVar5._12_4_ = (float)*(int *)(&UNK_0030a68c + lVar3) * quantBaseError;
    auVar4 = divps(auVar5,auVar2);
    *(undefined1 (*) [16])((long)e->_quantTableCbCr + lVar3) = auVar4;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x100);
  *(undefined8 *)((long)e->_channel_encode_data + 0xc) = 0;
  *(undefined8 *)((long)e->_channel_encode_data + 0x14) = 0;
  e->_channel_encode_data[0] = (DctCoderChannelData *)0x0;
  e->_channel_encode_data[1] = (DctCoderChannelData *)0x0;
  return 0x100;
}

Assistant:

exr_result_t
LossyDctEncoder_base_construct (
    LossyDctEncoder* e,
    float            quantBaseError,
    uint8_t*         packedAc,
    uint8_t*         packedDc,
    const uint16_t*  toNonlinear,
    int              width,
    int              height)
{
    e->_quantBaseError = quantBaseError;
    e->_width          = width;
    e->_height         = height;
    e->_toNonlinear    = toNonlinear;
    e->_numAcComp      = 0;
    e->_numDcComp      = 0;
    e->_packedAc       = packedAc;
    e->_packedDc       = packedDc;
    //
    // Here, we take the generic JPEG quantization tables and
    // normalize them by the smallest component in each table.
    // This gives us a relationship amongst the DCT components,
    // in terms of how sensitive each component is to
    // error.
    //
    // A higher normalized value means we can quantize more,
    // and a small normalized value means we can quantize less.
    //
    // Eventually, we will want an acceptable quantization
    // error range for each component. We find this by
    // multiplying some user-specified level (_quantBaseError)
    // by the normalized table (_quantTableY, _quantTableCbCr) to
    // find the acceptable quantization error range.
    //
    // The quantization table is not needed for decoding, and
    // is not transmitted. So, if you want to get really fancy,
    // you could derive some content-dependent quantization
    // table, and the decoder would not need to be changed. But,
    // for now, we'll just use statice quantization tables.
    //

    int jpegQuantTableY[] = {
        16, 11, 10, 16, 24,  40,  51,  61,  12, 12, 14, 19, 26,  58,  60,  55,
        14, 13, 16, 24, 40,  57,  69,  56,  14, 17, 22, 29, 51,  87,  80,  62,
        18, 22, 37, 56, 68,  109, 103, 77,  24, 35, 55, 64, 81,  104, 113, 92,
        49, 64, 78, 87, 103, 121, 120, 101, 72, 92, 95, 98, 112, 100, 103, 99};

    int jpegQuantTableYMin = 10;

    int jpegQuantTableCbCr[] = {
        17, 18, 24, 47, 99, 99, 99, 99, 18, 21, 26, 66, 99, 99, 99, 99,
        24, 26, 56, 99, 99, 99, 99, 99, 47, 66, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99,
        99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99, 99};

    int jpegQuantTableCbCrMin = 17;

    if (e->_quantBaseError < 0) e->_quantBaseError = 0;

    for (int idx = 0; idx < 64; ++idx)
    {
        e->_quantTableY[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableY[idx]) /
             (float) (jpegQuantTableYMin));

        e->_quantTableCbCr[idx] =
            (e->_quantBaseError * (float) (jpegQuantTableCbCr[idx]) /
             (float) (jpegQuantTableCbCrMin));
    }

    e->_channel_encode_data[0]    = NULL;
    e->_channel_encode_data[1]    = NULL;
    e->_channel_encode_data[2]    = NULL;
    e->_channel_encode_data_count = 0;

    return EXR_ERR_SUCCESS;
}